

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O3

char ** cmsysSystem_Parse_CommandForUnix(char *command,int flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ushort **ppuVar8;
  char **__dest;
  byte c;
  char **__src;
  byte *pbVar9;
  size_t __n;
  char **ppcVar10;
  int buffer_size;
  char *buffer_begin;
  int pointers_size;
  char *local_550;
  char **local_548;
  char **pointer_begin;
  char *local_pointers [32];
  char local_buffer [1024];
  
  if (flags != 0) {
    return (char **)0x0;
  }
  pointers_size = 0x20;
  local_548 = local_pointers;
  buffer_size = 0x400;
  buffer_begin = local_buffer;
  c = *command;
  local_550 = buffer_begin;
  pointer_begin = local_548;
  if (c == 0) {
LAB_00105c53:
    __src = pointer_begin;
    __n = (long)local_548 - (long)pointer_begin;
    __dest = (char **)malloc(__n + 8);
    if (__dest != (char **)0x0) {
      memcpy(__dest,__src,__n);
      *(undefined8 *)((long)__dest + __n) = 0;
      goto LAB_00105c87;
    }
  }
  else {
    pbVar9 = (byte *)(command + 1);
    bVar3 = false;
    bVar5 = false;
    bVar2 = false;
    bVar4 = false;
    bVar1 = false;
    do {
      if (bVar2) {
LAB_00105ad5:
        iVar7 = kwsysSystem__AppendByte(local_buffer,&buffer_begin,&local_550,&buffer_size,c);
        if (iVar7 == 0) {
LAB_00105bbf:
          kwsysSystem__AppendArgument
                    (local_pointers,&pointer_begin,&local_548,&pointers_size,local_buffer,
                     &buffer_begin,&local_550,&buffer_size);
          goto LAB_00105cb8;
        }
        bVar2 = false;
        bVar1 = true;
        bVar4 = true;
      }
      else {
        bVar2 = true;
        if (c != 0x5c) {
          if ((c != 0x27) || (bVar3)) {
            if (bVar5 || c != 0x22) {
              ppuVar8 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar8 + (ulong)c * 2 + 1) & 0x20) == 0) goto LAB_00105ad5;
              bVar2 = false;
              if (bVar1) {
                bVar6 = !bVar5;
                bVar4 = !bVar3;
                if (bVar6 && bVar4) {
                  iVar7 = kwsysSystem__AppendArgument
                                    (local_pointers,&pointer_begin,&local_548,&pointers_size,
                                     local_buffer,&buffer_begin,&local_550,&buffer_size);
                  bVar5 = false;
                  bVar3 = false;
                }
                else {
                  iVar7 = kwsysSystem__AppendByte
                                    (local_buffer,&buffer_begin,&local_550,&buffer_size,c);
                }
                bVar2 = false;
                bVar1 = !bVar6 || !bVar4;
                bVar4 = !bVar6 || !bVar4;
                if (iVar7 == 0) goto LAB_00105bbf;
              }
              else {
                bVar1 = false;
                bVar4 = bVar1;
              }
            }
            else {
              bVar3 = !bVar3;
              bVar1 = bVar4;
              if (bVar3) {
                bVar1 = true;
              }
              bVar2 = false;
              bVar5 = false;
              bVar4 = bVar1;
            }
          }
          else {
            bVar5 = !bVar5;
            if (bVar5) {
              bVar4 = true;
              bVar1 = true;
            }
            bVar2 = false;
            bVar3 = false;
          }
        }
      }
      c = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (c != 0);
    if ((!bVar1) ||
       (iVar7 = kwsysSystem__AppendArgument
                          (local_pointers,&pointer_begin,&local_548,&pointers_size,local_buffer,
                           &buffer_begin,&local_550,&buffer_size), iVar7 != 0)) goto LAB_00105c53;
  }
LAB_00105cb8:
  __src = pointer_begin;
  __dest = (char **)0x0;
  for (ppcVar10 = local_548; ppcVar10 != __src; ppcVar10 = ppcVar10 + -1) {
    free(ppcVar10[-1]);
  }
LAB_00105c87:
  if (__src != local_pointers) {
    free(__src);
  }
  if (buffer_begin != local_buffer) {
    free(buffer_begin);
  }
  return __dest;
}

Assistant:

char** kwsysSystem_Parse_CommandForUnix(const char* command, int flags)
{
  /* Validate the flags.  */
  if(flags != 0)
    {
    return 0;
    }

  /* Forward to our internal implementation.  */
  return kwsysSystem__ParseUnixCommand(command, flags);
}